

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O3

int cpu_exec_mipsel(uc_struct_conflict5 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUClass *pCVar3;
  TranslationBlock *pTVar4;
  void *pvVar5;
  long lVar6;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var7;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var8;
  CPUWatchpoint *pCVar9;
  _Bool _Var10;
  char cVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  TranslationBlock *pTVar15;
  ulong uVar16;
  long lVar17;
  TranslationBlock_conflict *pTVar18;
  TranslationBlock_conflict *pTVar19;
  uint cf_mask;
  uint flags;
  CPUClass *pCVar20;
  TranslationBlock_conflict *pTVar21;
  uint32_t cflags;
  list_item *plVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar20 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar20->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar20->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar20->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar12 != 0) {
    pCVar20 = cpu->cc;
  }
LAB_007df2d8:
  puVar1 = cpu->uc;
  uVar14 = cpu->exception_index;
  if (puVar1->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var10 = (*puVar1->stop_interrupt)(puVar1,uVar14);
    if (_Var10) {
      plVar22 = puVar1->hook[0xe].head;
      goto joined_r0x007df98e;
    }
    uVar14 = cpu->exception_index;
  }
  if (-1 < (int)uVar14) {
    if (0xffff < uVar14) {
      if (uVar14 == 0x10002) {
        pCVar3 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          for (pCVar9 = (cpu->watchpoints).tqh_first; pCVar9 != (CPUWatchpoint *)0x0;
              pCVar9 = (pCVar9->entry).tqe_next) {
            *(byte *)&pCVar9->flags = (byte)pCVar9->flags & 0x3f;
          }
        }
        (*pCVar3->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_007dfa19;
    }
    *(int *)(cpu[1].tb_jmp_cache + 0x14f) = (int)puVar1->next_pc;
    plVar22 = puVar1->hook[0].head;
    if (plVar22 == (list_item *)0x0) goto LAB_007df96d;
    bVar23 = false;
    do {
      pvVar2 = plVar22->data;
      if (pvVar2 == (void *)0x0) break;
      if (*(char *)((long)pvVar2 + 0x14) == '\0') {
        (**(code **)((long)pvVar2 + 0x28))
                  (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
        bVar23 = true;
      }
      plVar22 = plVar22->next;
    } while (plVar22 != (list_item *)0x0);
    if (!bVar23) goto LAB_007df96d;
    cpu->exception_index = -1;
  }
  pTVar19 = (TranslationBlock_conflict *)0x0;
  pTVar18 = pTVar19;
  while( true ) {
    pCVar3 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x9ea) = 0;
    uVar14 = cpu->interrupt_request;
    if (uVar14 != 0) {
      uVar13 = uVar14;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar13 = uVar14 & 0xffffeda5;
      }
      if ((char)uVar13 < '\0') {
        cpu->interrupt_request = uVar14 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_007df2d8;
      }
      if ((uVar13 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_007df2d8;
      }
      _Var10 = (*pCVar3->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar13);
      if (_Var10) {
        cpu->exception_index = -1;
        pTVar18 = (TranslationBlock_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar18 = (TranslationBlock_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar1 = cpu->uc;
    uVar14 = *(uint *)((long)cpu->env_ptr + 0x80);
    flags = *(uint *)((long)cpu->env_ptr + 0x2b94) & 0x1fffffff;
    uVar13 = uVar14 >> 6 ^ uVar14;
    uVar13 = uVar13 & 0x3f | uVar13 >> 6 & 0xfc0;
    pTVar15 = cpu->tb_jmp_cache[uVar13];
    cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if (((((pTVar15 == (TranslationBlock *)0x0) || ((uint)pTVar15->pc != uVar14)) ||
         (*(target_ulong_conflict *)((long)&pTVar15->pc + 4) != 0)) ||
        (((uint32_t)pTVar15->cs_base != flags ||
         (cpu->trace_dstate[0] != (ulong)*(uint *)&pTVar15->size)))) ||
       ((pTVar15->flags & 0xff0effff) != cf_mask)) {
      pTVar15 = (TranslationBlock *)tb_htable_lookup_mipsel(cpu,uVar14,0,flags,cf_mask);
      if (pTVar15 == (TranslationBlock *)0x0) {
        pTVar15 = (TranslationBlock *)tb_gen_code_mipsel(cpu,uVar14,0,flags,cflags);
        cpu->tb_jmp_cache[uVar13] = pTVar15;
        pTVar4 = puVar1->last_tb;
        if (pTVar4 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar15->pc;
          auVar24 = ZEXT416(*(uint *)((long)&pTVar15->cs_base + 4));
          auVar24 = pshuflw(auVar24,auVar24,0xe1);
          local_38 = auVar24._0_4_;
          local_50 = (ulong)(uint)pTVar4->pc;
          auVar24 = ZEXT416(*(uint *)((long)&pTVar4->cs_base + 4));
          auVar24 = pshuflw(auVar24,auVar24,0xe1);
          local_48 = auVar24._0_4_;
          for (plVar22 = puVar1->hook[0xf].head;
              (plVar22 != (list_item *)0x0 && (pvVar2 = plVar22->data, pvVar2 != (void *)0x0));
              plVar22 = plVar22->next) {
            if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
               (uVar16 = (ulong)(uint)pTVar15->pc,
               *(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18) ||
               uVar16 <= *(ulong *)((long)pvVar2 + 0x20) &&
               *(ulong *)((long)pvVar2 + 0x18) <= uVar16)) {
              (**(code **)((long)pvVar2 + 0x28))
                        (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar13] = pTVar15;
      }
    }
    if ((pTVar18 != (TranslationBlock_conflict *)0x0) &&
       (pTVar15->page_addr[0] == 0xffffffffffffffff)) {
      if (1 < (uint)pTVar19) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar15->flags & 0x40000) == 0) {
        LOCK();
        bVar23 = pTVar18->jmp_dest[(long)pTVar19] == 0;
        if (bVar23) {
          pTVar18->jmp_dest[(long)pTVar19] = (uintptr_t)pTVar15;
        }
        UNLOCK();
        if (bVar23) {
          pvVar2 = (pTVar18->tc).ptr;
          *(int *)(pTVar18->jmp_target_arg[(long)pTVar19] + (long)pvVar2) =
               (*(int *)&((tb_tc *)&pTVar15->cflags)->ptr -
               ((int)pTVar18->jmp_target_arg[(long)pTVar19] + (int)pvVar2)) + -4;
          pTVar18->jmp_list_next[(long)pTVar19] = pTVar15->jmp_target_arg[1];
          pTVar15->jmp_target_arg[1] = (ulong)pTVar18 | (ulong)pTVar19;
        }
      }
    }
    if (cpu->exit_request == false) {
      pvVar2 = ((tb_tc *)&pTVar15->cflags)->ptr;
      pvVar5 = cpu->env_ptr;
      tb_exec_lock_mipsel((TCGContext_conflict4 *)cpu->uc->tcg_ctx);
      uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar5 + 0x2c38) + 0x2e8) + 0x90))
                         (pvVar5,pvVar2);
      if (cpu->uc->nested_level == 1) {
        tb_exec_unlock_mipsel((TCGContext_conflict4 *)cpu->uc->tcg_ctx);
      }
      cpu->can_do_io = 1;
      pTVar21 = (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc);
      if ((uVar16 & 2) != 0) {
        if (*(long *)(*(long *)((long)pvVar5 + 0x2c38) + 0x358) == 0) {
          uVar14 = *(uint *)(*(long *)((long)pvVar5 + 0x2c38) + 0x578);
          if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
             (cpu->uc->quit_request == false)) {
            p_Var7 = cpu->cc->synchronize_from_tb;
            if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
              p_Var8 = cpu->cc->set_pc;
              if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_007dfa6b;
              (*p_Var8)((CPUState_conflict *)cpu,(ulong)pTVar21->pc);
            }
            else {
              (*p_Var7)((CPUState_conflict *)cpu,pTVar21);
            }
          }
        }
        cpu->tcg_exit_req = 0;
      }
      cpu->uc->last_tb = pTVar15;
      uVar14 = (uint)uVar16 & 3;
      pTVar19 = (TranslationBlock_conflict *)(ulong)uVar14;
      pTVar18 = pTVar21;
      if ((uVar14 == 3) &&
         (pTVar19 = (TranslationBlock_conflict *)0x3, pTVar18 = (TranslationBlock_conflict *)0x0,
         -1 < *(int *)(cpu[1].tb_jmp_cache + 0x13d))) {
        lVar6 = cpu->icount_budget;
        lVar17 = 0xffff;
        if (lVar6 < 0xffff) {
          lVar17 = lVar6;
        }
        uVar14 = (uint)lVar17;
        *(short *)(cpu[1].tb_jmp_cache + 0x13d) = (short)lVar17;
        cpu->icount_extra = lVar6 - (int)uVar14;
        pTVar18 = (TranslationBlock_conflict *)0x0;
        pTVar19 = (TranslationBlock_conflict *)0x3;
        if (0 < (int)uVar14 && lVar6 - (int)uVar14 == 0) {
          uVar13 = 0x7fff;
          if (uVar14 < 0x7fff) {
            uVar13 = uVar14;
          }
          pTVar18 = tb_gen_code_mipsel(cpu,pTVar21->pc,pTVar21->cs_base,pTVar21->flags,
                                       uVar13 | 0x10000);
          pTVar18->orig_tb = pTVar21;
          pvVar2 = (pTVar18->tc).ptr;
          pvVar5 = cpu->env_ptr;
          tb_exec_lock_mipsel((TCGContext_conflict4 *)cpu->uc->tcg_ctx);
          uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar5 + 0x2c38) + 0x2e8) + 0x90))
                             (pvVar5,pvVar2);
          if (cpu->uc->nested_level == 1) {
            tb_exec_unlock_mipsel((TCGContext_conflict4 *)cpu->uc->tcg_ctx);
          }
          cpu->can_do_io = 1;
          if ((uVar16 & 2) != 0) {
            if (*(long *)(*(long *)((long)pvVar5 + 0x2c38) + 0x358) == 0) {
              uVar14 = *(uint *)(*(long *)((long)pvVar5 + 0x2c38) + 0x578);
              if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
                 (cpu->uc->quit_request == false)) {
                p_Var7 = cpu->cc->synchronize_from_tb;
                if (p_Var7 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                  p_Var8 = cpu->cc->set_pc;
                  if (p_Var8 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_007dfa6b:
                    __assert_fail("cc->set_pc",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                  ,0x61,
                                  "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
                  }
                  (*p_Var8)((CPUState_conflict *)cpu,
                            (ulong)((TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc))->pc)
                  ;
                }
                else {
                  (*p_Var7)((CPUState_conflict *)cpu,
                            (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc));
                }
              }
            }
            cpu->tcg_exit_req = 0;
          }
          tb_phys_invalidate_mipsel
                    ((TCGContext_conflict4 *)cpu->uc->tcg_ctx,pTVar18,0xffffffffffffffff);
          tcg_tb_remove_mipsel((TCGContext_conflict4 *)cpu->uc->tcg_ctx,pTVar18);
          pTVar18 = (TranslationBlock_conflict *)0x0;
          pTVar19 = (TranslationBlock_conflict *)0x3;
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_007df2d8;
joined_r0x007df98e:
  if ((plVar22 == (list_item *)0x0) || (pvVar2 = plVar22->data, pvVar2 == (void *)0x0))
  goto LAB_007df9b8;
  if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
     (cVar11 = (**(code **)((long)pvVar2 + 0x28))(puVar1,*(undefined8 *)((long)pvVar2 + 0x30)),
     cVar11 != '\0')) goto LAB_007df9c3;
  plVar22 = plVar22->next;
  goto joined_r0x007df98e;
LAB_007df9b8:
  puVar1->invalid_error = 10;
  goto LAB_007df9c3;
LAB_007df96d:
  puVar1->invalid_error = 0x15;
  cpu->halted = 1;
LAB_007df9c3:
  uVar14 = 0x10001;
LAB_007dfa19:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar20->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar14;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}